

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(longlong lhs,
         SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  unsigned_long in_RSI;
  longlong in_RDI;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffc8;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffd0
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffd8;
  longlong local_18;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  
  local_18 = in_RDI;
  local_10.m_int = in_RSI;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_8);
  bVar1 = ModulusSimpleCaseHelper<unsigned_long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(local_18,local_10,&local_8);
  if (!bVar1) {
    SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffd0,&local_18);
    SafeInt::operator_cast_to_unsigned_long
              ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_stack_ffffffffffffffd0.m_int);
    SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0.m_int);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_stack_ffffffffffffffd0.m_int,in_stack_ffffffffffffffc8);
  }
  return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8.m_int
  ;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}